

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Room.h
# Opt level: O0

void __thiscall Room::resizeAccess(Room *this)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  uint *puVar3;
  int local_1c;
  int i;
  uint *newSpecialAccessedUsers;
  Room *this_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(this->specialAccessedUsers_count << 1);
  uVar2 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  puVar3 = (uint *)operator_new__(uVar2);
  for (local_1c = 0; local_1c < this->specialAccessedUsers_count; local_1c = local_1c + 1) {
    puVar3[local_1c] = this->specialAccessedUsers[local_1c];
  }
  this->specialAccessedUsers_count = this->specialAccessedUsers_count << 1;
  this->specialAccessedUsers = puVar3;
  return;
}

Assistant:

void resizeAccess(){
        unsigned int* newSpecialAccessedUsers = new unsigned int[specialAccessedUsers_count*2];
        for(int i=0;i<specialAccessedUsers_count;i++){
            newSpecialAccessedUsers[i] = specialAccessedUsers[i];
        }
        specialAccessedUsers_count<<=1;
        specialAccessedUsers = newSpecialAccessedUsers;
    }